

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

void mac_block_mesh(ossl_gost_imit_ctx *c,uchar *data)

{
  byte *in_RSI;
  byte *in_RDI;
  gost_ctx *unaff_retaddr;
  uchar *in_stack_00000018;
  gost_ctx *in_stack_00000020;
  
  if ((*(int *)(in_RDI + 0x1074) != 0) && (*(int *)(in_RDI + 0x1070) == 0x400)) {
    cryptopro_key_meshing(in_stack_00000020,in_stack_00000018);
  }
  mac_block(unaff_retaddr,in_RDI,in_RSI);
  *(uint *)(in_RDI + 0x1070) = (*(uint *)(in_RDI + 0x1070) & 0x3ff) + 8;
  return;
}

Assistant:

static void mac_block_mesh(struct ossl_gost_imit_ctx *c,
                           const unsigned char *data)
{
    /*
     * We are using NULL for iv because CryptoPro doesn't interpret
     * internal state of MAC algorithm as iv during keymeshing (but does
     * initialize internal state from iv in key transport
     */
    assert(c->count % 8 == 0 && c->count <= 1024);
    if (c->key_meshing && c->count == 1024) {
        cryptopro_key_meshing(&(c->cctx), NULL);
    }
    mac_block(&(c->cctx), c->buffer, data);
    c->count = c->count % 1024 + 8;
}